

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_add_asn1_uint64_with_tag(CBB *cbb,uint64_t value,CBS_ASN1_TAG tag)

{
  uint8_t value_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uStack_68;
  uint8_t byte;
  size_t i;
  undefined1 local_58 [4];
  int started;
  CBB child;
  CBS_ASN1_TAG tag_local;
  uint64_t value_local;
  CBB *cbb_local;
  
  bVar1 = false;
  child.u._28_4_ = tag;
  iVar2 = CBB_add_asn1(cbb,(CBB *)local_58,tag);
  if (iVar2 != 0) {
    for (uStack_68 = 0; uStack_68 < 8; uStack_68 = uStack_68 + 1) {
      uVar3 = value >> (('\a' - (char)uStack_68) * '\b' & 0x3fU);
      value_00 = (uint8_t)uVar3;
      if (bVar1) {
LAB_0018b4e8:
        iVar2 = CBB_add_u8((CBB *)local_58,value_00);
        if (iVar2 == 0) goto LAB_0018b532;
      }
      else if (value_00 != '\0') {
        if (((uVar3 & 0x80) == 0) || (iVar2 = CBB_add_u8((CBB *)local_58,'\0'), iVar2 != 0)) {
          bVar1 = true;
          goto LAB_0018b4e8;
        }
        goto LAB_0018b532;
      }
    }
    if ((bVar1) || (iVar2 = CBB_add_u8((CBB *)local_58,'\0'), iVar2 != 0)) {
      iVar2 = CBB_flush(cbb);
      return iVar2;
    }
  }
LAB_0018b532:
  cbb_on_error(cbb);
  return 0;
}

Assistant:

int CBB_add_asn1_uint64_with_tag(CBB *cbb, uint64_t value, CBS_ASN1_TAG tag) {
  CBB child;
  int started = 0;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    goto err;
  }

  for (size_t i = 0; i < 8; i++) {
    uint8_t byte = (value >> 8 * (7 - i)) & 0xff;
    if (!started) {
      if (byte == 0) {
        // Don't encode leading zeros.
        continue;
      }
      // If the high bit is set, add a padding byte to make it
      // unsigned.
      if ((byte & 0x80) && !CBB_add_u8(&child, 0)) {
        goto err;
      }
      started = 1;
    }
    if (!CBB_add_u8(&child, byte)) {
      goto err;
    }
  }

  // 0 is encoded as a single 0, not the empty string.
  if (!started && !CBB_add_u8(&child, 0)) {
    goto err;
  }

  return CBB_flush(cbb);

err:
  cbb_on_error(cbb);
  return 0;
}